

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlDOMWrapNSNormGatherInScopeNs(xmlNsMapPtr *map,xmlNodePtr node)

{
  int iVar1;
  xmlNsMapItemPtr_conflict pxVar2;
  bool bVar3;
  xmlNsMapItemPtr_conflict pxStack_38;
  int shadowed;
  xmlNsMapItemPtr_conflict mi;
  xmlNsPtr ns;
  xmlNodePtr cur;
  xmlNodePtr node_local;
  xmlNsMapPtr *map_local;
  
  if ((map == (xmlNsMapPtr *)0x0) || (*map != (xmlNsMapPtr)0x0)) {
    map_local._4_4_ = -1;
  }
  else if ((node == (xmlNodePtr)0x0) || (ns = (xmlNsPtr)node, node->type == XML_NAMESPACE_DECL)) {
    map_local._4_4_ = -1;
  }
  else {
    while( true ) {
      bVar3 = false;
      if (ns != (xmlNsPtr)0x0) {
        bVar3 = ns != (xmlNsPtr)ns[1].href;
      }
      if (!bVar3) break;
      if ((ns->type == XML_ELEMENT_NODE) && (ns[2].next != (_xmlNs *)0x0)) {
        mi = (xmlNsMapItemPtr_conflict)ns[2].next;
        do {
          bVar3 = false;
          if ((*map != (xmlNsMapPtr)0x0) && ((*map)->first != (xmlNsMapItemPtr_conflict)0x0)) {
            for (pxStack_38 = (*map)->first; pxStack_38 != (xmlNsMapItemPtr_conflict)0x0;
                pxStack_38 = pxStack_38->next) {
              if ((mi->newNs == (xmlNsPtr)pxStack_38->newNs->prefix) ||
                 (iVar1 = xmlStrEqual((xmlChar *)mi->newNs,pxStack_38->newNs->prefix), iVar1 != 0))
              {
                bVar3 = true;
                break;
              }
            }
          }
          pxVar2 = xmlDOMWrapNsMapAddItem(map,0,(xmlNsPtr)0x0,(xmlNsPtr)mi,-1);
          if (pxVar2 == (xmlNsMapItemPtr_conflict)0x0) {
            return -1;
          }
          if (bVar3) {
            pxVar2->shadowDepth = 0;
          }
          mi = mi->next;
        } while (mi != (xmlNsMapItemPtr)0x0);
      }
      ns = (xmlNsPtr)ns->context;
    }
    map_local._4_4_ = 0;
  }
  return map_local._4_4_;
}

Assistant:

static int
xmlDOMWrapNSNormGatherInScopeNs(xmlNsMapPtr *map,
				xmlNodePtr node)
{
    xmlNodePtr cur;
    xmlNsPtr ns;
    xmlNsMapItemPtr mi;
    int shadowed;

    if ((map == NULL) || (*map != NULL))
	return (-1);
    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL))
        return (-1);
    /*
    * Get in-scope ns-decls of @parent.
    */
    cur = node;
    while ((cur != NULL) && (cur != (xmlNodePtr) cur->doc)) {
	if (cur->type == XML_ELEMENT_NODE) {
	    if (cur->nsDef != NULL) {
		ns = cur->nsDef;
		do {
		    shadowed = 0;
		    if (XML_NSMAP_NOTEMPTY(*map)) {
			/*
			* Skip shadowed prefixes.
			*/
			XML_NSMAP_FOREACH(*map, mi) {
			    if ((ns->prefix == mi->newNs->prefix) ||
				xmlStrEqual(ns->prefix, mi->newNs->prefix)) {
				shadowed = 1;
				break;
			    }
			}
		    }
		    /*
		    * Insert mapping.
		    */
		    mi = xmlDOMWrapNsMapAddItem(map, 0, NULL,
			ns, XML_TREE_NSMAP_PARENT);
		    if (mi == NULL)
			return (-1);
		    if (shadowed)
			mi->shadowDepth = 0;
		    ns = ns->next;
		} while (ns != NULL);
	    }
	}
	cur = cur->parent;
    }
    return (0);
}